

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Frame::Init(Frame *this,uint8_t *frame,uint64_t length)

{
  void *pvVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  uint8_t *data;
  bool local_1;
  
  pvVar1 = operator_new__(in_RDX,(nothrow_t *)&std::nothrow);
  if (pvVar1 == (void *)0x0) {
    local_1 = false;
  }
  else {
    if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x28));
    }
    *(void **)(in_RDI + 0x28) = pvVar1;
    *(ulong *)(in_RDI + 0x38) = in_RDX;
    memcpy(*(void **)(in_RDI + 0x28),in_RSI,*(size_t *)(in_RDI + 0x38));
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Frame::Init(const uint8_t* frame, uint64_t length) {
  uint8_t* const data =
      new (std::nothrow) uint8_t[static_cast<size_t>(length)];  // NOLINT
  if (!data)
    return false;

  delete[] frame_;
  frame_ = data;
  length_ = length;

  memcpy(frame_, frame, static_cast<size_t>(length_));
  return true;
}